

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_defs.hpp
# Opt level: O1

bool __thiscall
iutest::floating_point<long_double>::NanSensitiveAlmostEquals
          (floating_point<long_double> *this,_Myt *rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar2 = *(ulong *)&this->m_v;
  uVar3 = *(ulong *)((long)&this->m_v + 8);
  if ((short)uVar3 < 0) {
    bVar7 = uVar2 != 0;
    uVar2 = -uVar2;
    uVar3 = -(ulong)bVar7 - (uVar3 & 0xffff);
  }
  else {
    uVar3 = (ulong)((uint)uVar3 & 0xffff | 0x8000);
  }
  uVar4 = *(ulong *)&rhs->m_v;
  uVar6 = *(ulong *)((long)&rhs->m_v + 8);
  if ((short)uVar6 < 0) {
    bVar7 = uVar4 != 0;
    uVar4 = -uVar4;
    uVar6 = -(ulong)bVar7 - (uVar6 & 0xffff);
  }
  else {
    uVar6 = (ulong)((uint)uVar6 & 0xffff | 0x8000);
  }
  uVar5 = uVar4 - uVar2;
  uVar1 = (uVar6 - uVar3) - (ulong)(uVar4 < uVar2);
  if (uVar6 < uVar3 || uVar6 - uVar3 < (ulong)(uVar4 < uVar2)) {
    uVar5 = uVar2 - uVar4;
    uVar1 = (uVar3 - uVar6) - (ulong)(uVar2 < uVar4);
  }
  return uVar1 < (uVar5 < 5);
}

Assistant:

UInt    enable_bits() const { return m_v.uv & kEnableBitMask; }